

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginDragDropTarget(void)

{
  ImGuiWindow *this;
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  ImGuiID IVar4;
  ImRect *r_abs;
  
  pIVar2 = GImGui;
  if ((((GImGui->DragDropActive == true) &&
       (uVar3 = (GImGui->LastItemData).StatusFlags, (uVar3 & 1) != 0)) &&
      (GImGui->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0)) &&
     ((this = GImGui->CurrentWindow,
      this->RootWindowDockTree == GImGui->HoveredWindowUnderMovingWindow->RootWindowDockTree &&
      (this->SkipItems == false)))) {
    uVar3 = (uVar3 & 2) << 4;
    r_abs = (ImRect *)((long)&(GImGui->LastItemData).Rect.Min.x + (ulong)uVar3);
    IVar4 = (GImGui->LastItemData).ID;
    if (IVar4 == 0) {
      IVar4 = ImGuiWindow::GetIDFromRectangle(this,r_abs);
    }
    if ((pIVar2->DragDropPayload).SourceId != IVar4) {
      if (pIVar2->DragDropWithinTarget == false) {
        IVar1 = *(ImVec2 *)((long)&(pIVar2->LastItemData).Rect.Max.x + (ulong)uVar3);
        (pIVar2->DragDropTargetRect).Min = r_abs->Min;
        (pIVar2->DragDropTargetRect).Max = IVar1;
        pIVar2->DragDropTargetId = IVar4;
        pIVar2->DragDropWithinTarget = true;
        return true;
      }
      __assert_fail("g.DragDropWithinTarget == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,10999,"bool ImGui::BeginDragDropTarget()");
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginDragDropTarget()
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (!(g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HoveredRect))
        return false;
    ImGuiWindow* hovered_window = g.HoveredWindowUnderMovingWindow;
    if (hovered_window == NULL || window->RootWindowDockTree != hovered_window->RootWindowDockTree || window->SkipItems)
        return false;

    const ImRect& display_rect = (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HasDisplayRect) ? g.LastItemData.DisplayRect : g.LastItemData.Rect;
    ImGuiID id = g.LastItemData.ID;
    if (id == 0)
        id = window->GetIDFromRectangle(display_rect);
    if (g.DragDropPayload.SourceId == id)
        return false;

    IM_ASSERT(g.DragDropWithinTarget == false);
    g.DragDropTargetRect = display_rect;
    g.DragDropTargetId = id;
    g.DragDropWithinTarget = true;
    return true;
}